

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O2

void __thiscall xray_re::se_monster::state_read(se_monster *this,xr_packet *packet,uint16_t size)

{
  ushort uVar1;
  bool *value;
  
  cse_alife_monster_base::state_read(&this->super_cse_alife_monster_base,packet,size);
  uVar1 = *(ushort *)
           &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
            super_cse_alife_creature_abstract.field_0x28;
  if (0x7f < uVar1) {
    if (uVar1 == 0x80) {
      xr_packet::r_sz(packet,&this->m_off_level_vertex_id);
      xr_packet::r_sz(packet,&this->m_active_section);
      return;
    }
    __assert_fail("m_version <= CSE_VERSION_COP",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                  ,0x104,"virtual void xray_re::se_monster::state_read(xr_packet &, uint16_t)");
  }
  if (uVar1 < 0x7a) {
    if (uVar1 == 0x65) {
      if (*(ushort *)
           &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
            super_cse_alife_creature_abstract.field_0x2a < 2) {
        return;
      }
    }
    else {
      if (uVar1 == 0x68) {
        if (*(ushort *)
             &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
              super_cse_alife_creature_abstract.field_0x2a < 3) {
          return;
        }
LAB_0018c9cc:
        xr_packet::r<unsigned_char>
                  (packet,&(this->super_cse_alife_monster_base).super_cse_ph_skeleton.field_0x2e);
        return;
      }
      if (uVar1 == 0x75) {
        if (*(ushort *)
             &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
              super_cse_alife_creature_abstract.field_0x2a < 4) {
          return;
        }
        goto LAB_0018c9cc;
      }
      if (uVar1 != 0x76) {
        if ((ushort)(uVar1 - 0x27) < 8) {
          return;
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0x126,"virtual void xray_re::se_monster::state_read(xr_packet &, uint16_t)");
      }
      if (*(ushort *)
           &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
            super_cse_alife_creature_abstract.field_0x2a < 3) {
        return;
      }
      xr_packet::r<unsigned_char>
                (packet,&(this->super_cse_alife_monster_base).super_cse_ph_skeleton.field_0x2e);
      if (2 < (byte)(this->super_cse_alife_monster_base).super_cse_ph_skeleton.field_0x2e) {
        xr_packet::skip_sz(packet);
      }
      if (*(ushort *)
           &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
            super_cse_alife_creature_abstract.field_0x2a < 5) {
        return;
      }
    }
    value = (bool *)&(this->super_cse_alife_monster_base).super_cse_ph_skeleton.field_0x2f;
  }
  else {
    if (0x7c < uVar1) {
      __assert_fail("m_version <= CSE_VERSION_CS",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x10a,"virtual void xray_re::se_monster::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r<unsigned_char>
              (packet,&(this->super_cse_alife_monster_base).super_cse_ph_skeleton.field_0x2e);
    if (2 < (byte)(this->super_cse_alife_monster_base).super_cse_ph_skeleton.field_0x2e) {
      xr_packet::skip_sz(packet);
    }
    if (*(ushort *)
         &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
          super_cse_alife_creature_abstract.field_0x2a < 7) {
      return;
    }
    xr_packet::r_sz(packet,&this->m_squad_id);
    if (*(ushort *)
         &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
          super_cse_alife_creature_abstract.field_0x2a < 8) {
      return;
    }
    value = &this->m_sim_forced_online;
  }
  xr_packet::r_bool(packet,value);
  return;
}

Assistant:

void se_monster::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_monster_base::state_read(packet, size);
	if (m_version >= CSE_VERSION_0x80) {
		xr_assert(m_version <= CSE_VERSION_COP);

		packet.r_sz(m_off_level_vertex_id);
		packet.r_sz(m_active_section);
	}
	else if (m_version >= CSE_VERSION_0x7a) {
		xr_assert(m_version <= CSE_VERSION_CS);
		packet.r_u8(m_job_online);
		if (m_job_online > 2)
			packet.skip_sz();
		if (m_script_version >= 7)
			packet.r_sz(m_squad_id);
		if (m_script_version >= 8)
			packet.r_bool(m_sim_forced_online);
	} else if (m_version == CSE_VERSION_SOC) {
		if (m_script_version >= 3) {
			packet.r_u8(m_job_online);
			if (m_job_online > 2)
				packet.skip_sz();
		}
		if (m_script_version >= 5)
			packet.r_bool(m_was_in_smart_terrain);
	} else if (m_version == CSE_VERSION_2571) {
		if (m_script_version >= 4)
			packet.r_u8(m_job_online);
	} else if (m_version == CSE_VERSION_2232) {
		if (m_script_version >= 3)
			packet.r_u8(m_job_online);
	} else if (m_version == CSE_VERSION_2215) {
		if (m_script_version >= 2)
			packet.r_bool(m_was_in_smart_terrain);
	} else if (m_version >= CSE_VERSION_0x27 && m_version <= CSE_VERSION_0x2e) {
		// no script entity
	} else {
		xr_not_implemented();
	}
}